

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c14n.c
# Opt level: O2

int xmlC14NVisibleNsStackAdd(xmlC14NVisibleNsStackPtr cur,xmlNsPtr ns,xmlNodePtr node)

{
  uint uVar1;
  xmlNsPtr *ppxVar2;
  xmlNodePtr *ppxVar3;
  uint uVar4;
  int iVar5;
  
  if (cur == (xmlC14NVisibleNsStackPtr)0x0) {
    return 1;
  }
  ppxVar2 = cur->nsTab;
  if (ppxVar2 == (xmlNsPtr *)0x0) {
    if (cur->nodeTab != (xmlNodePtr *)0x0) {
      return 1;
    }
  }
  else if (cur->nodeTab == (xmlNodePtr *)0x0) {
    return 1;
  }
  iVar5 = cur->nsCurEnd;
  uVar1 = cur->nsMax;
  if ((int)uVar1 <= iVar5) {
    if ((int)uVar1 < 1) {
      iVar5 = 0x10;
    }
    else {
      iVar5 = -1;
      if (uVar1 < 1000000000) {
        uVar4 = uVar1 + 1 >> 1;
        iVar5 = uVar4 + uVar1;
        if (1000000000 - uVar4 < uVar1) {
          iVar5 = 1000000000;
        }
      }
    }
    ppxVar2 = (xmlNsPtr *)(*xmlRealloc)(ppxVar2,(long)iVar5 << 3);
    if (ppxVar2 == (xmlNsPtr *)0x0) {
      return -1;
    }
    cur->nsTab = ppxVar2;
    ppxVar3 = (xmlNodePtr *)(*xmlRealloc)(cur->nodeTab,(long)iVar5 << 3);
    if (ppxVar3 == (xmlNodePtr *)0x0) {
      return -1;
    }
    cur->nodeTab = ppxVar3;
    cur->nsMax = iVar5;
    ppxVar2 = cur->nsTab;
    iVar5 = cur->nsCurEnd;
  }
  ppxVar2[iVar5] = ns;
  cur->nodeTab[iVar5] = node;
  cur->nsCurEnd = iVar5 + 1;
  return 0;
}

Assistant:

static int
xmlC14NVisibleNsStackAdd(xmlC14NVisibleNsStackPtr cur, xmlNsPtr ns, xmlNodePtr node) {
    if((cur == NULL) ||
       ((cur->nsTab == NULL) && (cur->nodeTab != NULL)) ||
       ((cur->nsTab != NULL) && (cur->nodeTab == NULL)))
	return (1);

    if (cur->nsMax <= cur->nsCurEnd) {
	xmlNsPtr *tmp1;
        xmlNodePtr *tmp2;
	int newSize;

        newSize = xmlGrowCapacity(cur->nsMax,
                                  sizeof(tmp1[0]) + sizeof(tmp2[0]),
                                  XML_NAMESPACES_DEFAULT, XML_MAX_ITEMS);

	tmp1 = xmlRealloc(cur->nsTab, newSize * sizeof(tmp1[0]));
	if (tmp1 == NULL)
	    return (-1);
	cur->nsTab = tmp1;

	tmp2 = xmlRealloc(cur->nodeTab, newSize * sizeof(tmp2[0]));
	if (tmp2 == NULL)
	    return (-1);
	cur->nodeTab = tmp2;

	cur->nsMax = newSize;
    }
    cur->nsTab[cur->nsCurEnd] = ns;
    cur->nodeTab[cur->nsCurEnd] = node;

    ++cur->nsCurEnd;

    return (0);
}